

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringNewCodePoint(TranslateToFuzzReader *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  pEVar1 = make(this,(Type)0x2);
  pEVar2 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
  pEVar2->_id = StringNewId;
  (pEVar2->type).id = 0;
  *(undefined4 *)(pEVar2 + 1) = 2;
  pEVar2[1].type.id = (uintptr_t)pEVar1;
  *(undefined8 *)(pEVar2 + 2) = 0;
  pEVar2[2].type.id = 0;
  wasm::StringNew::finalize();
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringNewCodePoint() {
  auto codePoint = make(Type::i32);
  return builder.makeStringNew(StringNewFromCodePoint, codePoint);
}